

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O0

Btor2Line * btor2parser_iter_next(Btor2LineIterator *it)

{
  int64_t iVar1;
  long *in_RDI;
  Btor2Line *res;
  Btor2Line *local_8;
  
  if (in_RDI[1] == 0) {
    local_8 = (Btor2Line *)0x0;
  }
  else {
    local_8 = *(Btor2Line **)(*(long *)(*in_RDI + 8) + in_RDI[1] * 8);
    iVar1 = find_non_zero_line_bfr((Btor2Parser *)*in_RDI,in_RDI[1] + 1);
    in_RDI[1] = iVar1;
  }
  return local_8;
}

Assistant:

Btor2Line *
btor2parser_iter_next (Btor2LineIterator *it)
{
  Btor2Line *res;
  if (!it->next) return 0;
  assert (0 < it->next);
  assert (it->next < it->reader->ntable);
  res      = it->reader->table[it->next];
  it->next = find_non_zero_line_bfr (it->reader, it->next + 1);
  return res;
}